

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::CoroutineBase::CoroutineBase
          (CoroutineBase *this,coroutine_handle<void> coroutine,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036d340;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_0036d270;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0036d2b8;
  (this->coroutine)._M_fr_ptr = coroutine._M_fr_ptr;
  this->resultRef = resultRef;
  (this->onReadyEvent).event = (Event *)0x0;
  this->waiting = true;
  this->hasSuspendedAtLeastOnce = false;
  (this->promiseNodeForTrace).ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  (this->maybeDisposalResults).ptr = (DisposalResults *)0x0;
  return;
}

Assistant:

CoroutineBase::CoroutineBase(stdcoro::coroutine_handle<> coroutine, ExceptionOrValue& resultRef,
                             SourceLocation location)
    : Event(location),
      coroutine(coroutine),
      resultRef(resultRef) {}